

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlBufDumpEnumeration(xmlOutputBufferPtr buf,xmlEnumerationPtr cur)

{
  xmlEnumerationPtr local_18;
  xmlEnumerationPtr cur_local;
  xmlOutputBufferPtr buf_local;
  
  for (local_18 = cur; local_18 != (xmlEnumerationPtr)0x0; local_18 = local_18->next) {
    xmlOutputBufferWriteString(buf,(char *)local_18->name);
    if (local_18->next != (_xmlEnumeration *)0x0) {
      xmlOutputBufferWrite(buf,3," | ");
    }
  }
  xmlOutputBufferWrite(buf,1,")");
  return;
}

Assistant:

static void
xmlBufDumpEnumeration(xmlOutputBufferPtr buf, xmlEnumerationPtr cur) {
    while (cur != NULL) {
        xmlOutputBufferWriteString(buf, (const char *) cur->name);
        if (cur->next != NULL)
            xmlOutputBufferWrite(buf, 3, " | ");

        cur = cur->next;
    }

    xmlOutputBufferWrite(buf, 1, ")");
}